

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convertUTF.cpp
# Opt level: O3

ConversionResult
convertUTF::ConvertUTF8toUTF32
          (UTF8 **sourceStart,UTF8 *sourceEnd,UTF32 **targetStart,UTF32 *targetEnd,
          ConversionFlags flags)

{
  long lVar1;
  byte bVar2;
  byte bVar3;
  Boolean BVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  uint *puVar9;
  byte *source;
  bool bVar10;
  ConversionResult local_50;
  
  source = *sourceStart;
  puVar9 = *targetStart;
  if (source < sourceEnd) {
    local_50 = conversionOK;
    do {
      bVar2 = *source;
      uVar6 = (uint)bVar2;
      bVar3 = trailingBytesForUTF8[bVar2];
      uVar8 = (ulong)bVar3;
      if (sourceEnd <= source + uVar8) {
        local_50 = sourceExhausted;
        break;
      }
      lVar1 = uVar8 + 1;
      BVar4 = anon_unknown_11::isLegalUTF8(source,(int)lVar1);
      if (!BVar4) {
LAB_0018239a:
        local_50 = sourceIllegal;
        break;
      }
      iVar5 = 0;
      switch(uVar8) {
      case 0:
        uVar7 = (uint)bVar3;
        break;
      case 5:
        iVar5 = (uint)bVar2 << 6;
        uVar6 = (uint)source[1];
        source = source + 1;
      case 4:
        iVar5 = (uVar6 + iVar5) * 0x40;
        uVar6 = (uint)source[1];
        source = source + 1;
      case 3:
        iVar5 = (uVar6 + iVar5) * 0x40;
        uVar6 = (uint)source[1];
        source = source + 1;
      case 2:
        iVar5 = (uVar6 + iVar5) * 0x40;
        uVar6 = (uint)source[1];
        source = source + 1;
      case 1:
        uVar7 = (uVar6 + iVar5) * 0x40;
        uVar6 = (uint)source[1];
        source = source + 1;
        break;
      default:
        goto switchD_001822b2_default;
      }
      source = source + 1;
      iVar5 = uVar6 + uVar7;
switchD_001822b2_default:
      if (targetEnd <= puVar9) {
        source = source + -lVar1;
        local_50 = targetExhausted;
        break;
      }
      uVar6 = iVar5 - *(int *)(offsetsFromUTF8 + uVar8 * 4);
      if (uVar6 < 0x110000) {
        bVar10 = (uVar6 & 0x1ff800) == 0xd800;
        if (bVar10) {
          uVar6 = 0xfffd;
        }
        if (bVar10 && flags == strictConversion) {
          source = source + -lVar1;
          goto LAB_0018239a;
        }
      }
      else {
        local_50 = sourceIllegal;
        uVar6 = 0xfffd;
      }
      *puVar9 = uVar6;
      puVar9 = puVar9 + 1;
    } while (source < sourceEnd);
  }
  else {
    local_50 = conversionOK;
  }
  *sourceStart = source;
  *targetStart = puVar9;
  return local_50;
}

Assistant:

ConversionResult ConvertUTF8toUTF32(const UTF8** sourceStart, const UTF8* sourceEnd, UTF32** targetStart,
                                    const UTF32* targetEnd, const ConversionFlags flags)
{
    ConversionResult result = ConversionResult::conversionOK;
    const UTF8* source = *sourceStart;
    UTF32* target = *targetStart;
    while (source < sourceEnd)
    {
        UTF32 ch = 0;
        const uint8_t extraBytesToRead = trailingBytesForUTF8[*source];
        if (source + extraBytesToRead >= sourceEnd)
        {
            result = ConversionResult::sourceExhausted;
            break;
        }
        /* Do this check whether lenient or strict */
        if (!isLegalUTF8(source, extraBytesToRead + 1))
        {
            result = ConversionResult::sourceIllegal;
            break;
        }
        /*
         * The cases all fall through. See "Note A" below.
         */
        switch (extraBytesToRead)
        {
        case 5:
            ch += *source++;
            ch <<= 6;
            [[fallthrough]];
        case 4:
            ch += *source++;
            ch <<= 6;
            [[fallthrough]];
        case 3:
            ch += *source++;
            ch <<= 6;
            [[fallthrough]];
        case 2:
            ch += *source++;
            ch <<= 6;
            [[fallthrough]];
        case 1:
            ch += *source++;
            ch <<= 6;
            [[fallthrough]];
        case 0:
            ch += *source++;
            break;
        default:;
        }
        ch -= offsetsFromUTF8[extraBytesToRead];

        if (target >= targetEnd)
        {
            source -= (extraBytesToRead + 1); /* Back up the source pointer! */
            result = ConversionResult::targetExhausted;
            break;
        }
        if (ch <= UNI_MAX_LEGAL_UTF32)
        {
            /*
             * UTF-16 surrogate values are illegal in UTF-32, and anything
             * over Plane 17 (> 0x10FFFF) is illegal.
             */
            if (ch >= UNI_SUR_HIGH_START && ch <= UNI_SUR_LOW_END)
            {
                if (flags == ConversionFlags::strictConversion)
                {
                    source -= (extraBytesToRead + 1); /* return to the illegal value itself */
                    result = ConversionResult::sourceIllegal;
                    break;
                }
                *target++ = UNI_REPLACEMENT_CHAR;
            }
            else
            {
                *target++ = ch;
            }
        }
        else
        { /* i.e., ch > UNI_MAX_LEGAL_UTF32 */
            result = ConversionResult::sourceIllegal;
            *target++ = UNI_REPLACEMENT_CHAR;
        }
    }
    *sourceStart = source;
    *targetStart = target;
    return result;
}